

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O0

bool private_ACUtils_ADynArray_reserve
               (void *dynArray,size_t reserveSize,bool forceExactSize,size_t typeSize)

{
  ulong uVar1;
  long lVar2;
  char *tmpBuffer;
  size_t aimedCapacity;
  private_ACUtils_DynArray_Prototype *prototype;
  size_t typeSize_local;
  bool forceExactSize_local;
  size_t reserveSize_local;
  void *dynArray_local;
  
  if (dynArray != (void *)0x0) {
    if ((reserveSize <= *(ulong *)((long)dynArray + 0x20)) &&
       (*(long *)((long)dynArray + 0x28) != 0)) {
      return true;
    }
    tmpBuffer = (char *)reserveSize;
    if ((*(long *)((long)dynArray + 0x10) != 0) &&
       ((forceExactSize == false ||
        (uVar1 = (**(code **)((long)dynArray + 0x10))(0,typeSize), reserveSize < uVar1)))) {
      tmpBuffer = (char *)(**(code **)((long)dynArray + 0x10))(reserveSize,typeSize);
    }
    if ((reserveSize <= tmpBuffer) &&
       (lVar2 = (**dynArray)(*(undefined8 *)((long)dynArray + 0x28),(long)tmpBuffer * typeSize),
       lVar2 != 0)) {
      *(char **)((long)dynArray + 0x20) = tmpBuffer;
      *(long *)((long)dynArray + 0x28) = lVar2;
      return true;
    }
  }
  return false;
}

Assistant:

ACUTILS_HD_FUNC bool private_ACUtils_ADynArray_reserve(void *dynArray, size_t reserveSize, bool forceExactSize, size_t typeSize)
{
    if(dynArray != NULL) {
        struct private_ACUtils_DynArray_Prototype* prototype = (struct private_ACUtils_DynArray_Prototype*) dynArray;
        if(prototype->capacity < reserveSize || prototype->buffer == NULL) {
            size_t aimedCapacity = reserveSize;
            if(prototype->growStrategy != NULL && (!forceExactSize || reserveSize < prototype->growStrategy(0, typeSize)))
                aimedCapacity = prototype->growStrategy(reserveSize, typeSize);
            if(aimedCapacity >= reserveSize) {
                char* tmpBuffer = (char*) prototype->reallocator(prototype->buffer, aimedCapacity * typeSize);
                if(tmpBuffer != NULL) {
                    prototype->capacity = aimedCapacity;
                    prototype->buffer = tmpBuffer;
                    return true;
                }
            }
        } else {
            return true;
        }
    }
    return false;
}